

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * cmsys::regatom(int *flagp)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  bool bVar5;
  int local_30;
  char ender;
  int len;
  int rxpclassend;
  int rxpclass;
  int flags;
  char *ret;
  int *flagp_local;
  
  *flagp = 0;
  pbVar4 = regparse + 1;
  iVar2 = (int)(char)*regparse;
  ret = (char *)flagp;
  if (*regparse == 0) {
LAB_007903ea:
    regparse = pbVar4;
    printf("RegularExpression::compile(): Internal error.\n");
    return (char *)0x0;
  }
  if (iVar2 == 0x24) {
    regparse = pbVar4;
    _rxpclass = regnode('\x02');
  }
  else if (iVar2 == 0x28) {
    regparse = pbVar4;
    _rxpclass = reg(1,&rxpclassend);
    if (_rxpclass == (char *)0x0) {
      return (char *)0x0;
    }
    *(uint *)ret = rxpclassend & 5U | *(uint *)ret;
  }
  else {
    if (iVar2 == 0x29) goto LAB_007903ea;
    if (iVar2 - 0x2aU < 2) {
LAB_00790405:
      regparse = pbVar4;
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return (char *)0x0;
    }
    if (iVar2 == 0x2e) {
      regparse = pbVar4;
      _rxpclass = regnode('\x03');
      *(uint *)ret = *(uint *)ret | 3;
    }
    else {
      if (iVar2 == 0x3f) goto LAB_00790405;
      if (iVar2 == 0x5b) {
        if (*pbVar4 == 0x5e) {
          regparse = pbVar4;
          _rxpclass = regnode('\x05');
          regparse = regparse + 1;
        }
        else {
          regparse = pbVar4;
          _rxpclass = regnode('\x04');
        }
        if ((*regparse == 0x5d) || (*regparse == 0x2d)) {
          bVar1 = *regparse;
          regparse = regparse + 1;
          regc(bVar1);
        }
        while( true ) {
          bVar5 = false;
          if (*regparse != 0) {
            bVar5 = *regparse != 0x5d;
          }
          if (!bVar5) break;
          if (*regparse == 0x2d) {
            pbVar4 = regparse + 1;
            if ((*pbVar4 == 0x5d) || (*pbVar4 == 0)) {
              regparse = pbVar4;
              regc('-');
            }
            else {
              len = regparse[-1] + 1;
              bVar1 = *pbVar4;
              regparse = pbVar4;
              if (bVar1 + 1 < (uint)len) {
                printf("RegularExpression::compile(): Invalid range in [].\n");
                return (char *)0x0;
              }
              for (; len <= (int)(uint)bVar1; len = len + 1) {
                regc((char)len);
              }
              regparse = regparse + 1;
            }
          }
          else {
            bVar1 = *regparse;
            regparse = regparse + 1;
            regc(bVar1);
          }
        }
        regc('\0');
        if (*regparse != 0x5d) {
          printf("RegularExpression::compile(): Unmatched [].\n");
          return (char *)0x0;
        }
        regparse = regparse + 1;
        *(uint *)ret = *(uint *)ret | 3;
      }
      else if (iVar2 == 0x5c) {
        if (*pbVar4 == 0) {
          regparse = pbVar4;
          printf("RegularExpression::compile(): Trailing backslash.\n");
          return (char *)0x0;
        }
        regparse = pbVar4;
        _rxpclass = regnode('\b');
        bVar1 = *regparse;
        regparse = regparse + 1;
        regc(bVar1);
        regc('\0');
        *(uint *)ret = *(uint *)ret | 3;
      }
      else if (iVar2 == 0x5e) {
        regparse = pbVar4;
        _rxpclass = regnode('\x01');
      }
      else {
        if (iVar2 == 0x7c) goto LAB_007903ea;
        sVar3 = strcspn((char *)regparse,"^$.[()|?+*\\");
        local_30 = (int)sVar3;
        if (local_30 < 1) {
          printf("RegularExpression::compile(): Internal error.\n");
          return (char *)0x0;
        }
        bVar1 = regparse[local_30];
        if ((1 < local_30) && (((bVar1 == 0x2a || (bVar1 == 0x2b)) || (bVar1 == 0x3f)))) {
          local_30 = local_30 + -1;
        }
        *(uint *)ret = *(uint *)ret | 1;
        if (local_30 == 1) {
          *(uint *)ret = *(uint *)ret | 2;
        }
        _rxpclass = regnode('\b');
        for (; 0 < local_30; local_30 = local_30 + -1) {
          bVar1 = *regparse;
          regparse = regparse + 1;
          regc(bVar1);
        }
        regc('\0');
      }
    }
  }
  return _rxpclass;
}

Assistant:

static char* regatom (int *flagp) {
    char* ret;
    int   flags;

    *flagp = WORST;             // Tentatively.

    switch (*regparse++) {
        case '^':
            ret = regnode(BOL);
            break;
        case '$':
            ret = regnode(EOL);
            break;
        case '.':
            ret = regnode(ANY);
            *flagp |= HASWIDTH | SIMPLE;
            break;
        case '[':{
                int    rxpclass;
                int    rxpclassend;

                if (*regparse == '^') { // Complement of range.
                    ret = regnode(ANYBUT);
                    regparse++;
                }
                else
                    ret = regnode(ANYOF);
                if (*regparse == ']' || *regparse == '-')
                    regc(*regparse++);
                while (*regparse != '\0' && *regparse != ']') {
                    if (*regparse == '-') {
                        regparse++;
                        if (*regparse == ']' || *regparse == '\0')
                            regc('-');
                        else {
                            rxpclass = UCHARAT(regparse - 2) + 1;
                            rxpclassend = UCHARAT(regparse);
                            if (rxpclass > rxpclassend + 1) {
                               //RAISE Error, SYM(RegularExpression), SYM(Invalid_Range),
                               printf ("RegularExpression::compile(): Invalid range in [].\n");
                               return 0;
                            }
                            for (; rxpclass <= rxpclassend; rxpclass++)
                              regc(static_cast<char>(rxpclass));
                            regparse++;
                        }
                    }
                    else
                        regc(*regparse++);
                }
                regc('\0');
                if (*regparse != ']') {
                    //RAISE Error, SYM(RegularExpression), SYM(Unmatched_Bracket),
                    printf ("RegularExpression::compile(): Unmatched [].\n");
                    return 0;
                }
                regparse++;
                *flagp |= HASWIDTH | SIMPLE;
            }
            break;
        case '(':
            ret = reg(1, &flags);
            if (ret == 0)
                return (0);
            *flagp |= flags & (HASWIDTH | SPSTART);
            break;
        case '\0':
        case '|':
        case ')':
            //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
            printf ("RegularExpression::compile(): Internal error.\n"); // Never here
            return 0;
        case '?':
        case '+':
        case '*':
            //RAISE Error, SYM(RegularExpression), SYM(No_Operand),
            printf ("RegularExpression::compile(): ?+* follows nothing.\n");
            return 0;
        case '\\':
            if (*regparse == '\0') {
                //RAISE Error, SYM(RegularExpression), SYM(Trailing_Backslash),
                printf ("RegularExpression::compile(): Trailing backslash.\n");
                return 0;
            }
            ret = regnode(EXACTLY);
            regc(*regparse++);
            regc('\0');
            *flagp |= HASWIDTH | SIMPLE;
            break;
        default:{
                int    len;
                char   ender;

                regparse--;
                len = int(strcspn(regparse, META));
                if (len <= 0) {
                    //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
                    printf ("RegularExpression::compile(): Internal error.\n");
                    return 0;
                }
                ender = *(regparse + len);
                if (len > 1 && ISMULT(ender))
                    len--;      // Back off clear of ?+* operand.
                *flagp |= HASWIDTH;
                if (len == 1)
                    *flagp |= SIMPLE;
                ret = regnode(EXACTLY);
                while (len > 0) {
                    regc(*regparse++);
                    len--;
                }
                regc('\0');
            }
            break;
    }
    return (ret);
}